

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O1

QJsonObject __thiscall QJsonDocument::object(QJsonDocument *this)

{
  long lVar1;
  long *in_RSI;
  
  lVar1 = *in_RSI;
  if (((lVar1 == 0) || (*(int *)(lVar1 + 0x10) != 0xa0)) ||
     (*(QCborContainerPrivate **)(lVar1 + 8) == (QCborContainerPrivate *)0x0)) {
    QJsonObject::QJsonObject((QJsonObject *)this);
  }
  else {
    QJsonObject::QJsonObject((QJsonObject *)this,*(QCborContainerPrivate **)(lVar1 + 8));
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
}

Assistant:

QJsonObject QJsonDocument::object() const
{
    if (isObject()) {
        if (auto container = QJsonPrivate::Value::container(d->value))
            return QJsonObject(container);
    }
    return QJsonObject();
}